

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O1

void __thiscall
AS_02::TimedText::Type5UUIDFilenameResolver::Type5UUIDFilenameResolver
          (Type5UUIDFilenameResolver *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_IResourceResolver)._vptr_IResourceResolver =
       (_func_int **)&PTR__Type5UUIDFilenameResolver_0016d6c0;
  p_Var1 = &(this->m_ResourceMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ResourceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ResourceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ResourceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ResourceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_ResourceMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_Dirname)._M_dataplus._M_p = (pointer)&(this->m_Dirname).field_2;
  (this->m_Dirname)._M_string_length = 0;
  (this->m_Dirname).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

AS_02::TimedText::Type5UUIDFilenameResolver::Type5UUIDFilenameResolver() {}